

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool __thiscall QSslSocket::waitForEncrypted(QSslSocket *this,int msecs)

{
  long lVar1;
  QSslSocketPrivate *this_00;
  QTcpSocket *pQVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  SocketState SVar6;
  int iVar7;
  undefined4 uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if ((((this_00->plainSocket != (QTcpSocket *)0x0) && (this_00->connectionEncrypted == false)) &&
      ((this_00->mode != UnencryptedMode || (this_00->autoStartHandshake == true)))) &&
     (bVar3 = QSslSocketPrivate::verifyProtocolSupported(this_00,"QSslSocket::waitForEncrypted:"),
     bVar3)) {
    QElapsedTimer::start();
    SVar6 = QAbstractSocket::state(&this_00->plainSocket->super_QAbstractSocket);
    if ((SVar6 == ConnectedState) ||
       (cVar4 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x130))
                          (this_00->plainSocket,msecs), cVar4 != '\0')) {
      do {
        cVar4 = this_00->connectionEncrypted;
        if ((bool)cVar4 != false) break;
        if (this_00->mode == UnencryptedMode) {
          startClientEncryption(this);
        }
        pQVar2 = this_00->plainSocket;
        iVar7 = QElapsedTimer::elapsed();
        uVar8 = qt_subtract_from_timeout(msecs,iVar7);
        cVar5 = (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xb8))(pQVar2,uVar8);
      } while (cVar5 != '\0');
      goto LAB_0024d418;
    }
  }
  cVar4 = '\0';
LAB_0024d418:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

bool QSslSocket::waitForEncrypted(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket || d->connectionEncrypted)
        return false;
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return false;
    if (!d->verifyProtocolSupported("QSslSocket::waitForEncrypted:"))
        return false;

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (d->plainSocket->state() != QAbstractSocket::ConnectedState) {
        // Wait until we've entered connected state.
        if (!d->plainSocket->waitForConnected(msecs))
            return false;
    }

    while (!d->connectionEncrypted) {
        // Start the handshake, if this hasn't been started yet.
        if (d->mode == UnencryptedMode)
            startClientEncryption();
        // Loop, waiting until the connection has been encrypted or an error
        // occurs.
        if (!d->plainSocket->waitForReadyRead(qt_subtract_from_timeout(msecs, stopWatch.elapsed())))
            return false;
    }
    return d->connectionEncrypted;
}